

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flow_cutter.h
# Opt level: O2

bool __thiscall
flow_cutter::MultiCutter::
advance<flow_cutter::Graph<flow_cutter::expanded_graph::Tail<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::Head<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::BackArc<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::Capacity,flow_cutter::expanded_graph::OutArc<ConstRefIDFunc<RangeIDIDMultiFunc>>>,flow_cutter::PseudoDepthFirstSearch,flow_cutter::PierceNodeScore>
          (MultiCutter *this,
          Graph<flow_cutter::expanded_graph::Tail<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::Head<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::BackArc<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::Capacity,_flow_cutter::expanded_graph::OutArc<ConstRefIDFunc<RangeIDIDMultiFunc>_>_>
          *graph,TemporaryData *tmp,PseudoDepthFirstSearch *search_algo,
          PierceNodeScore *score_pierce_node,bool should_skip_non_maximum_sides)

{
  pointer pDVar1;
  bool bVar2;
  int iVar3;
  vector<int,_std::allocator<int>_> *pvVar4;
  undefined4 extraout_var;
  uint uVar5;
  vector<flow_cutter::DistanceAwareCutter,_std::allocator<flow_cutter::DistanceAwareCutter>_>
  *__range3;
  iterator __end3;
  long lVar6;
  undefined3 in_register_00000089;
  uint uVar7;
  ulong uVar8;
  iterator __begin3;
  pointer pDVar9;
  long lVar10;
  int local_1530;
  int local_152c;
  undefined8 local_1528;
  undefined4 local_151c;
  anon_class_16_2_0ed2c766 my_score_pierce_node;
  type x;
  
  local_151c = CONCAT31(in_register_00000089,should_skip_non_maximum_sides);
  if ((graph->tail).original_node_count == this->current_smaller_side_size) {
    bVar2 = false;
  }
  else {
    pvVar4 = BasicCutter::get_current_cut
                       (&(this->cutter_list).
                         super__Vector_base<flow_cutter::DistanceAwareCutter,_std::allocator<flow_cutter::DistanceAwareCutter>_>
                         ._M_impl.super__Vector_impl_data._M_start[this->current_cutter_id].cutter);
    uVar8 = (ulong)((long)(pvVar4->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                          super__Vector_impl_data._M_finish -
                   (long)(pvVar4->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                         super__Vector_impl_data._M_start) >> 2;
    do {
      local_1530 = 0;
      while( true ) {
        pDVar9 = (this->cutter_list).
                 super__Vector_base<flow_cutter::DistanceAwareCutter,_std::allocator<flow_cutter::DistanceAwareCutter>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pDVar1 = (this->cutter_list).
                 super__Vector_base<flow_cutter::DistanceAwareCutter,_std::allocator<flow_cutter::DistanceAwareCutter>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if ((int)(((long)pDVar1 - (long)pDVar9) / 0x14c0) <= local_1530) break;
        DistanceAwareCutter::DistanceAwareCutter(&x,pDVar9 + local_1530);
        my_score_pierce_node.i = &local_1530;
        my_score_pierce_node.score_pierce_node = score_pierce_node;
        if (((x.cutter.cut_available == true) &&
            (pvVar4 = BasicCutter::get_current_cut(&x.cutter),
            (int)uVar8 ==
            (int)((ulong)((long)(pvVar4->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                super__Vector_impl_data._M_finish -
                         (long)(pvVar4->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                               super__Vector_impl_data._M_start) >> 2))) &&
           (bVar2 = DistanceAwareCutter::
                    advance<flow_cutter::Graph<flow_cutter::expanded_graph::Tail<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::Head<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::BackArc<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::Capacity,flow_cutter::expanded_graph::OutArc<ConstRefIDFunc<RangeIDIDMultiFunc>>>,flow_cutter::PseudoDepthFirstSearch,flow_cutter::MultiCutter::advance<flow_cutter::Graph<flow_cutter::expanded_graph::Tail<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::Head<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::BackArc<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::Capacity,flow_cutter::expanded_graph::OutArc<ConstRefIDFunc<RangeIDIDMultiFunc>>>,flow_cutter::PseudoDepthFirstSearch,flow_cutter::PierceNodeScore>(flow_cutter::Graph<flow_cutter::expanded_graph::Tail<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::Head<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::BackArc<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::Capacity,flow_cutter::expanded_graph::OutArc<ConstRefIDFunc<RangeIDIDMultiFunc>>>const&,flow_cutter::TemporaryData&,flow_cutter::PseudoDepthFirstSearch_const&,flow_cutter::PierceNodeScore_const&,bool)::_lambda(int,int,bool,int,int)_1_>
                              (&x,graph,tmp,search_algo,&my_score_pierce_node), bVar2)) {
          do {
            bVar2 = DistanceAwareCutter::
                    does_next_advance_increase_cut<flow_cutter::Graph<flow_cutter::expanded_graph::Tail<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::Head<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::BackArc<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::Capacity,flow_cutter::expanded_graph::OutArc<ConstRefIDFunc<RangeIDIDMultiFunc>>>,flow_cutter::MultiCutter::advance<flow_cutter::Graph<flow_cutter::expanded_graph::Tail<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::Head<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::BackArc<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::Capacity,flow_cutter::expanded_graph::OutArc<ConstRefIDFunc<RangeIDIDMultiFunc>>>,flow_cutter::PseudoDepthFirstSearch,flow_cutter::PierceNodeScore>(flow_cutter::Graph<flow_cutter::expanded_graph::Tail<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::Head<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::BackArc<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::Capacity,flow_cutter::expanded_graph::OutArc<ConstRefIDFunc<RangeIDIDMultiFunc>>>const&,flow_cutter::TemporaryData&,flow_cutter::PseudoDepthFirstSearch_const&,flow_cutter::PierceNodeScore_const&,bool)::_lambda(int,int,bool,int,int)_1_>
                              (&x,graph,&my_score_pierce_node);
            if (bVar2) break;
            bVar2 = DistanceAwareCutter::
                    advance<flow_cutter::Graph<flow_cutter::expanded_graph::Tail<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::Head<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::BackArc<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::Capacity,flow_cutter::expanded_graph::OutArc<ConstRefIDFunc<RangeIDIDMultiFunc>>>,flow_cutter::PseudoDepthFirstSearch,flow_cutter::MultiCutter::advance<flow_cutter::Graph<flow_cutter::expanded_graph::Tail<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::Head<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::BackArc<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::Capacity,flow_cutter::expanded_graph::OutArc<ConstRefIDFunc<RangeIDIDMultiFunc>>>,flow_cutter::PseudoDepthFirstSearch,flow_cutter::PierceNodeScore>(flow_cutter::Graph<flow_cutter::expanded_graph::Tail<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::Head<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::BackArc<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::Capacity,flow_cutter::expanded_graph::OutArc<ConstRefIDFunc<RangeIDIDMultiFunc>>>const&,flow_cutter::TemporaryData&,flow_cutter::PseudoDepthFirstSearch_const&,flow_cutter::PierceNodeScore_const&,bool)::_lambda(int,int,bool,int,int)_1_>
                              (&x,graph,tmp,search_algo,&my_score_pierce_node);
          } while (((byte)local_151c & bVar2) != 0);
        }
        DistanceAwareCutter::operator=
                  ((this->cutter_list).
                   super__Vector_base<flow_cutter::DistanceAwareCutter,_std::allocator<flow_cutter::DistanceAwareCutter>_>
                   ._M_impl.super__Vector_impl_data._M_start + local_1530,&x);
        DistanceAwareCutter::~DistanceAwareCutter(&x);
        local_1530 = local_1530 + 1;
      }
      uVar8 = 0x7fffffff;
      for (; uVar7 = (uint)uVar8, pDVar9 != pDVar1; pDVar9 = pDVar9 + 1) {
        if ((pDVar9->cutter).cut_available == true) {
          pvVar4 = BasicCutter::get_current_cut(&pDVar9->cutter);
          uVar5 = (uint)((ulong)((long)(pvVar4->super__Vector_base<int,_std::allocator<int>_>).
                                       _M_impl.super__Vector_impl_data._M_finish -
                                (long)(pvVar4->super__Vector_base<int,_std::allocator<int>_>).
                                      _M_impl.super__Vector_impl_data._M_start) >> 2);
          if ((int)uVar7 < (int)uVar5) {
            uVar5 = uVar7;
          }
          uVar8 = (ulong)uVar5;
        }
      }
      if (uVar7 == 0x7fffffff) {
        return false;
      }
      local_1528 = 0;
      lVar10 = 0;
      local_152c = -1;
      for (lVar6 = 0;
          pDVar9 = (this->cutter_list).
                   super__Vector_base<flow_cutter::DistanceAwareCutter,_std::allocator<flow_cutter::DistanceAwareCutter>_>
                   ._M_impl.super__Vector_impl_data._M_start,
          lVar6 < (int)(((long)(this->cutter_list).
                               super__Vector_base<flow_cutter::DistanceAwareCutter,_std::allocator<flow_cutter::DistanceAwareCutter>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)pDVar9) / 0x14c0);
          lVar6 = lVar6 + 1) {
        if ((*(char *)((long)(pDVar9->node_dist + 0xffffffffffffffff) + lVar10) == '\x01') &&
           (pvVar4 = BasicCutter::get_current_cut
                               ((BasicCutter *)((long)(pDVar9->cutter).assimilated + lVar10)),
           uVar7 == (uint)((ulong)((long)(pvVar4->super__Vector_base<int,_std::allocator<int>_>).
                                         _M_impl.super__Vector_impl_data._M_finish -
                                  (long)(pvVar4->super__Vector_base<int,_std::allocator<int>_>).
                                        _M_impl.super__Vector_impl_data._M_start) >> 2))) {
          iVar3 = BasicCutter::get_current_smaller_cut_side_size
                            ((BasicCutter *)
                             ((long)(((this->cutter_list).
                                      super__Vector_base<flow_cutter::DistanceAwareCutter,_std::allocator<flow_cutter::DistanceAwareCutter>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->cutter).
                                    assimilated + lVar10));
          if ((int)local_1528 < iVar3) {
            iVar3 = BasicCutter::get_current_smaller_cut_side_size
                              ((BasicCutter *)
                               ((long)(((this->cutter_list).
                                        super__Vector_base<flow_cutter::DistanceAwareCutter,_std::allocator<flow_cutter::DistanceAwareCutter>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->cutter).
                                      assimilated + lVar10));
            local_1528 = CONCAT44(extraout_var,iVar3);
            local_152c = (int)lVar6;
          }
        }
        lVar10 = lVar10 + 0x14c0;
      }
    } while ((int)local_1528 <= this->current_smaller_side_size);
    this->current_cutter_id = local_152c;
    iVar3 = BasicCutter::get_current_smaller_cut_side_size(&pDVar9[local_152c].cutter);
    this->current_smaller_side_size = iVar3;
    bVar2 = true;
  }
  return bVar2;
}

Assistant:

bool advance(const Graph& graph, TemporaryData& tmp,
        const SearchAlgorithm& search_algo,
        const ScorePierceNode& score_pierce_node,
        bool should_skip_non_maximum_sides = true)
    {
        if (graph.node_count() / 2 == get_current_smaller_cut_side_size())
            return false;

        int current_cut_size = cutter_list[current_cutter_id].get_current_cut().size();
        for (;;) {
            for (int i = 0; i < (int)cutter_list.size(); ++i) {
                auto x = std::move(cutter_list[i]);
                auto my_score_pierce_node = [&](int x, int side,
                                                bool causes_augmenting_path,
                                                int source_dist, int target_dist) {
                    return score_pierce_node(x, side, causes_augmenting_path, source_dist,
                        target_dist, i);
                };
                if (x.is_cut_available()) {
                    if ((int)x.get_current_cut().size() == current_cut_size) {
                        assert(
                            x.does_next_advance_increase_cut(graph, my_score_pierce_node));
                        if (x.advance(graph, tmp, search_algo, my_score_pierce_node)) {
                            assert((int)x.get_current_cut().size() > current_cut_size);
                            while (!x.does_next_advance_increase_cut(graph,
                                my_score_pierce_node)) {
                                if (!x.advance(graph, tmp, search_algo, my_score_pierce_node))
                                    break;
                                if (!should_skip_non_maximum_sides)
                                    break;
                            }
                        }
                    }
                }

                cutter_list[i] = std::move(x);
            }

            int next_cut_size = std::numeric_limits<int>::max();
            for (auto& x : cutter_list)
                if (x.is_cut_available())
                    min_to(next_cut_size, (int)x.get_current_cut().size());

            if (next_cut_size == std::numeric_limits<int>::max())
                return false;

            int best_cutter_weight = 0;
            int best_cutter_id = -1;
            for (int i = 0; i < (int)cutter_list.size(); ++i) {
                if (cutter_list[i].is_cut_available()) {
                    if ((int)cutter_list[i].get_current_cut().size() == next_cut_size && cutter_list[i].get_current_smaller_cut_side_size() > best_cutter_weight) {
                        best_cutter_id = i;
                        best_cutter_weight = cutter_list[i].get_current_smaller_cut_side_size();
                    }
                }
            }

            assert(best_cutter_id != -1);

            current_cut_size = next_cut_size;

            if (best_cutter_weight <= current_smaller_side_size)
                continue;

            current_cutter_id = best_cutter_id;
            current_smaller_side_size = cutter_list[current_cutter_id].get_current_smaller_cut_side_size();
            return true;
        }
    }